

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBoxShadow.cpp
# Opt level: O2

void __thiscall
Rml::GeometryBoxShadow::Generate
          (GeometryBoxShadow *this,Geometry *out_shadow_geometry,CallbackTexture *out_shadow_texture
          ,RenderManager *render_manager,Element *element,Geometry *background_border_geometry,
          BoxShadowList *shadow_list,CornerSizes border_radius,float opacity)

{
  RenderManager *pRVar1;
  Vector2f VVar2;
  Vector2f b;
  Vector2f b_00;
  pointer origin;
  pointer pBVar3;
  int iVar4;
  int index;
  BoxShadow *shadow;
  RenderManager *pRVar5;
  BoxShadowList *__range1;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar8;
  Rectangle<float> other;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_118 [16];
  _Function_base local_108;
  code *pcStack_f0;
  Mesh mesh;
  float local_b8;
  float fStack_b4;
  RenderBox box;
  _Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> local_48;
  
  pRVar1 = *(RenderManager **)
            &(background_border_geometry->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             ).resource_handle;
  for (pRVar5 = (background_border_geometry->
                super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                ).render_manager; pRVar5 != pRVar1;
      pRVar5 = (RenderManager *)
               ((long)&(pRVar5->geometry_list).free_slots.super__Bvector_base<std::allocator<bool>_>
                       ._M_impl.super__Bvector_impl_data + 8)) {
    fVar6 = Element::ResolveLength
                      ((Element *)render_manager,
                       *(NumericValue *)
                        ((long)&(pRVar5->geometry_list).elements.
                                super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                ._M_impl.super__Vector_impl_data + 0xc));
    *(float *)((long)&(pRVar5->geometry_list).elements.
                      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                      ._M_impl.super__Vector_impl_data + 0xc) = fVar6;
    *(undefined4 *)
     ((long)&(pRVar5->geometry_list).elements.
             super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
             ._M_impl.super__Vector_impl_data + 0x10) = 0x40;
    fVar6 = Element::ResolveLength
                      ((Element *)render_manager,
                       *(NumericValue *)
                        ((long)&(pRVar5->geometry_list).elements.
                                super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                ._M_impl.super__Vector_impl_data + 0x14));
    *(float *)((long)&(pRVar5->geometry_list).elements.
                      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                      ._M_impl.super__Vector_impl_data + 0x14) = fVar6;
    *(undefined4 *)
     &(pRVar5->geometry_list).free_slots.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base = 0x40;
    fVar6 = Element::ResolveLength
                      ((Element *)render_manager,
                       *(NumericValue *)((long)&pRVar5->render_interface + 4));
    *(float *)((long)&pRVar5->render_interface + 4) = fVar6;
    *(undefined4 *)
     &(pRVar5->geometry_list).elements.
      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
      ._M_impl.super__Vector_impl_data._M_start = 0x40;
    fVar6 = Element::ResolveLength
                      ((Element *)render_manager,
                       *(NumericValue *)
                        ((long)&(pRVar5->geometry_list).elements.
                                super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                ._M_impl.super__Vector_impl_data + 4));
    *(float *)((long)&(pRVar5->geometry_list).elements.
                      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                      ._M_impl.super__Vector_impl_data + 4) = fVar6;
    *(undefined4 *)
     ((long)&(pRVar5->geometry_list).elements.
             super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
             ._M_impl.super__Vector_impl_data + 8) = 0x40;
  }
  pRVar5 = (background_border_geometry->
           super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
           ).render_manager;
  pRVar1 = *(RenderManager **)
            &(background_border_geometry->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             ).resource_handle;
  local_148 = ZEXT816(0);
  local_158 = ZEXT816(0);
  for (; pRVar5 != pRVar1;
      pRVar5 = (RenderManager *)
               ((long)&(pRVar5->geometry_list).free_slots.super__Bvector_base<std::allocator<bool>_>
                       ._M_impl.super__Bvector_impl_data + 8)) {
    if (*(char *)((long)&(pRVar5->geometry_list).free_slots.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 + 4) == '\0') {
      fVar8 = *(float *)((long)&(pRVar5->geometry_list).elements.
                                super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                ._M_impl.super__Vector_impl_data + 0xc) * 1.5 +
              *(float *)((long)&(pRVar5->geometry_list).elements.
                                super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                ._M_impl.super__Vector_impl_data + 0x14);
      fVar6 = *(float *)((long)&pRVar5->render_interface + 4);
      fVar7 = *(float *)((long)&(pRVar5->geometry_list).elements.
                                super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                ._M_impl.super__Vector_impl_data + 4);
      b.y = fVar7 - fVar8;
      b.x = fVar6 - fVar8;
      VVar2 = Math::Min<Rml::Vector2<float>>((Vector2f)local_158._0_8_,b);
      local_158._8_4_ = extraout_XMM0_Dc;
      local_158._0_4_ = VVar2.x;
      local_158._4_4_ = VVar2.y;
      local_158._12_4_ = extraout_XMM0_Dd;
      b_00.y = fVar8 + fVar7;
      b_00.x = fVar8 + fVar6;
      VVar2 = Math::Max<Rml::Vector2<float>>((Vector2f)local_148._0_8_,b_00);
      local_148._8_4_ = extraout_XMM0_Dc_00;
      local_148._0_4_ = VVar2.x;
      local_148._4_4_ = VVar2.y;
      local_148._12_4_ = extraout_XMM0_Dd_00;
    }
  }
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0);
  index = 0;
  while( true ) {
    iVar4 = Element::GetNumBoxes((Element *)render_manager);
    if (iVar4 <= index) break;
    Element::GetRenderBox(&box,(Element *)render_manager,Border,index);
    other.p1.x = box.fill_size.x + box.border_offset.x;
    other.p1.y = box.fill_size.y + box.border_offset.y;
    other.p0.x = box.border_offset.x;
    other.p0.y = box.border_offset.y;
    mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
    super__Vector_impl_data._0_16_ = Rectangle<float>::Join((Rectangle<float> *)&mesh,other);
    index = index + 1;
  }
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._0_16_ =
       Rectangle<float>::Extend
                 ((Rectangle<float> *)&mesh,(Vector2Type)(local_158._0_8_ ^ 0x8000000080000000),
                  (Vector2Type)local_148._0_8_);
  Math::ExpandToPixelGrid((Rectanglef *)&mesh);
  origin = mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  fVar6 = (float)(int)(mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                       _M_impl.super__Vector_impl_data._M_finish._0_4_ -
                      mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_);
  fVar7 = (float)(int)(mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                       _M_impl.super__Vector_impl_data._M_finish._4_4_ -
                      mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_);
  local_b8 = border_radius._M_elems[0];
  fStack_b4 = border_radius._M_elems[1];
  box.border_widths._M_elems[2] = border_radius._M_elems[2];
  box.border_widths._M_elems[3] = border_radius._M_elems[3];
  box.border_widths._M_elems[0] = local_b8;
  box.border_widths._M_elems[1] = fStack_b4;
  box.border_radius._M_elems[1] = fVar7;
  box.border_radius._M_elems[0] = fVar6;
  box.border_radius._M_elems._8_8_ =
       (ulong)mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
              super__Vector_impl_data._M_start ^ 0x8000000080000000;
  local_48._M_impl.super__Vector_impl_data._M_start =
       (pointer)(background_border_geometry->
                super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                ).render_manager;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)
        &(background_border_geometry->
         super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
         ).resource_handle;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)background_border_geometry[1].
                super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                .render_manager;
  (background_border_geometry->
  super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  ).render_manager = (RenderManager *)0x0;
  *(undefined8 *)
   &(background_border_geometry->
    super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ).resource_handle = 0;
  background_border_geometry[1].
  super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  .render_manager = (RenderManager *)0x0;
  box.fill_size = (Vector2f)element;
  box.border_offset = (Vector2f)render_manager;
  Geometry::Release(&mesh,(Geometry *)this,ClearMesh);
  VVar2.y = (float)(int)fVar7;
  VVar2.x = (float)(int)fVar6;
  MeshUtilities::GenerateQuad
            (&mesh,(Vector2f)origin,VVar2,
             (ColourbPremultiplied)(((int)(opacity * 255.0) & 0xffU) * 0x1010101));
  local_108._M_functor._M_unused._M_object = (pointer)0x0;
  local_108._M_functor._8_8_ = (pointer)0x0;
  local_108._M_manager = (_Manager_type)0x0;
  pcStack_f0 = (code *)0x0;
  local_108._M_functor._M_unused._M_object = operator_new(0x48);
  pBVar3 = local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  (((pointer)local_108._M_functor._M_unused._0_8_)->mesh).indices.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)box.border_radius._M_elems._0_8_;
  (((pointer)local_108._M_functor._M_unused._0_8_)->mesh).indices.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)box.border_radius._M_elems._8_8_;
  (((pointer)local_108._M_functor._M_unused._0_8_)->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(box.border_widths._M_elems[1],box.border_widths._M_elems[0])
  ;
  (((pointer)local_108._M_functor._M_unused._0_8_)->mesh).indices.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(box.border_widths._M_elems[3],box.border_widths._M_elems[2]);
  (((pointer)local_108._M_functor._M_unused._0_8_)->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)box.fill_size;
  (((pointer)local_108._M_functor._M_unused._0_8_)->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)box.border_offset;
  ((pointer)local_108._M_functor._M_unused._0_8_)->handle =
       (CompiledGeometryHandle)local_48._M_impl.super__Vector_impl_data._M_start;
  (((pointer)((long)local_108._M_functor._M_unused._0_8_ + 0x38))->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_48._M_impl.super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((pointer)((long)local_108._M_functor._M_unused._0_8_ + 0x38))->mesh).vertices.
  super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pBVar3;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcStack_f0 = ::std::
               _Function_handler<bool_(const_Rml::CallbackTextureInterface_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBoxShadow.cpp:91:26)>
               ::_M_invoke;
  local_108._M_manager =
       ::std::
       _Function_handler<bool_(const_Rml::CallbackTextureInterface_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBoxShadow.cpp:91:26)>
       ::_M_manager;
  RenderManager::MakeCallbackTexture
            ((RenderManager *)local_118,(CallbackTextureFunction *)out_shadow_texture);
  UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  ::operator=((UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               *)out_shadow_geometry,
              (UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               *)local_118);
  UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  ::~UniqueRenderResource
            ((UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
              *)local_118);
  ::std::_Function_base::~_Function_base(&local_108);
  RenderManager::MakeGeometry((RenderManager *)local_118,(Mesh *)out_shadow_texture);
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>::
  operator=((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             *)this,(UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                     *)local_118);
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>::
  ~UniqueRenderResource
            ((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
              *)local_118);
  Mesh::~Mesh(&mesh);
  ::std::_Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void GeometryBoxShadow::Generate(Geometry& out_shadow_geometry, CallbackTexture& out_shadow_texture, RenderManager& render_manager, Element* element,
	Geometry& background_border_geometry, BoxShadowList shadow_list, const CornerSizes border_radius, const float opacity)
{
	// Find the box-shadow texture dimension and offset required to cover all box-shadows and element boxes combined.
	Vector2f element_offset_in_texture;
	Vector2i texture_dimensions;

	// Resolve all lengths to px units.
	for (BoxShadow& shadow : shadow_list)
	{
		shadow.blur_radius = NumericValue(element->ResolveLength(shadow.blur_radius), Unit::PX);
		shadow.spread_distance = NumericValue(element->ResolveLength(shadow.spread_distance), Unit::PX);
		shadow.offset_x = NumericValue(element->ResolveLength(shadow.offset_x), Unit::PX);
		shadow.offset_y = NumericValue(element->ResolveLength(shadow.offset_y), Unit::PX);
	}

	{
		Vector2f extend_min;
		Vector2f extend_max;

		// Extend the render-texture to encompass box-shadow blur and spread.
		for (const BoxShadow& shadow : shadow_list)
		{
			if (!shadow.inset)
			{
				const float extend = 1.5f * shadow.blur_radius.number + shadow.spread_distance.number;
				const Vector2f offset = {shadow.offset_x.number, shadow.offset_y.number};
				extend_min = Math::Min(extend_min, offset - Vector2f(extend));
				extend_max = Math::Max(extend_max, offset + Vector2f(extend));
			}
		}

		Rectanglef texture_region;

		// Extend the render-texture further to cover all the element's boxes.
		for (int i = 0; i < element->GetNumBoxes(); i++)
		{
			const RenderBox box = element->GetRenderBox(BoxArea::Border, i);
			texture_region = texture_region.Join(Rectanglef::FromPositionSize(box.GetBorderOffset(), box.GetFillSize()));
		}

		texture_region = texture_region.Extend(-extend_min, extend_max);
		Math::ExpandToPixelGrid(texture_region);

		element_offset_in_texture = -texture_region.TopLeft();
		texture_dimensions = Vector2i(texture_region.Size());
	}

	// Callback for generating the box-shadow texture. Using a callback ensures that the texture can be regenerated at any time, for example if the
	// device loses its GPU context and the client calls Rml::ReleaseTextures().
	auto texture_callback = [&background_border_geometry, element, border_radius, texture_dimensions, element_offset_in_texture,
								shadow_list = std::move(shadow_list)](const CallbackTextureInterface& texture_interface) -> bool {
		RenderManager& render_manager = texture_interface.GetRenderManager();

		Mesh mesh_padding;        // Render geometry for inner box-shadow.
		Mesh mesh_padding_border; // Clipping mask for outer box-shadow.

		bool has_inner_shadow = false;
		bool has_outer_shadow = false;
		for (const BoxShadow& shadow : shadow_list)
		{
			if (shadow.inset)
				has_inner_shadow = true;
			else
				has_outer_shadow = true;
		}

		// Generate the geometry for all the element's boxes and extend the render-texture further to cover all of them.
		for (int i = 0; i < element->GetNumBoxes(); i++)
		{
			ColourbPremultiplied white(255);
			if (has_inner_shadow)
				MeshUtilities::GenerateBackground(mesh_padding, element->GetRenderBox(BoxArea::Padding, i), white);
			if (has_outer_shadow)
				MeshUtilities::GenerateBackground(mesh_padding_border, element->GetRenderBox(BoxArea::Border, i), white);
		}

		const RenderState initial_render_state = render_manager.GetState();
		render_manager.ResetState();
		render_manager.SetScissorRegion(Rectanglei::FromSize(texture_dimensions));

		// The scissor region will be clamped to the current window size, check the resulting scissor region.
		const Rectanglei scissor_region = render_manager.GetScissorRegion();
		if (scissor_region.Width() <= 0 || scissor_region.Height() <= 0)
		{
			// The window may become zero-sized for example when minimized. Just skip the texture generation for now, we
			// expect to be called again later when the window is restored.
			render_manager.SetState(initial_render_state);
			return false;
		}
		if (scissor_region != Rectanglei::FromSize(texture_dimensions))
		{
			Log::Message(Log::LT_INFO,
				"The desired box-shadow texture dimensions (%d, %d) are larger than the current window region (%d, %d). "
				"Results may be clipped. In element: %s",
				texture_dimensions.x, texture_dimensions.y, scissor_region.Width(), scissor_region.Height(), element->GetAddress().c_str());
		}

		render_manager.PushLayer();

		background_border_geometry.Render(element_offset_in_texture);

		for (int shadow_index = (int)shadow_list.size() - 1; shadow_index >= 0; shadow_index--)
		{
			const BoxShadow& shadow = shadow_list[shadow_index];
			const Vector2f shadow_offset = {shadow.offset_x.number, shadow.offset_y.number};
			const bool inset = shadow.inset;
			const float spread_distance = shadow.spread_distance.number;
			const float blur_radius = shadow.blur_radius.number;

			CornerSizes spread_radii = border_radius;
			for (int i = 0; i < 4; i++)
			{
				float& radius = spread_radii[i];
				float spread_factor = (inset ? -1.f : 1.f);
				if (radius < spread_distance)
				{
					const float ratio_minus_one = (radius / spread_distance) - 1.f;
					spread_factor *= 1.f + ratio_minus_one * ratio_minus_one * ratio_minus_one;
				}
				radius = Math::Max(radius + spread_factor * spread_distance, 0.f);
			}

			Mesh mesh_shadow;

			// Generate the shadow geometry. For outer box-shadows it is rendered normally, while for inset box-shadows it is used as a clipping mask.
			for (int i = 0; i < element->GetNumBoxes(); i++)
			{
				const float signed_spread_distance = (inset ? -spread_distance : spread_distance);
				RenderBox render_box = element->GetRenderBox(inset ? BoxArea::Padding : BoxArea::Border, i);
				render_box.SetFillSize(Math::Max(render_box.GetFillSize() + Vector2f(2.f * signed_spread_distance), Vector2f{0.001f}));
				render_box.SetBorderRadius(spread_radii);
				render_box.SetBorderOffset(render_box.GetBorderOffset() - Vector2f(signed_spread_distance));
				MeshUtilities::GenerateBackground(mesh_shadow, render_box, shadow.color);
			}

			CompiledFilter blur;
			if (blur_radius >= 0.5f)
			{
				blur = render_manager.CompileFilter("blur", Dictionary{{"sigma", Variant(0.5f * blur_radius)}});
				if (blur)
					render_manager.PushLayer();
			}

			Geometry geometry_shadow = render_manager.MakeGeometry(std::move(mesh_shadow));

			if (inset)
			{
				render_manager.SetClipMask(ClipMaskOperation::SetInverse, &geometry_shadow, shadow_offset + element_offset_in_texture);

				for (Rml::Vertex& vertex : mesh_padding.vertices)
					vertex.colour = shadow.color;

				// @performance: Don't need to copy the mesh if this is the last use of it.
				Geometry geometry_padding = render_manager.MakeGeometry(Mesh(mesh_padding));
				geometry_padding.Render(element_offset_in_texture);

				render_manager.SetClipMask(ClipMaskOperation::Set, &geometry_padding, element_offset_in_texture);
			}
			else
			{
				Mesh mesh = mesh_padding_border;
				Geometry geometry_padding_border = render_manager.MakeGeometry(std::move(mesh));
				render_manager.SetClipMask(ClipMaskOperation::SetInverse, &geometry_padding_border, element_offset_in_texture);
				geometry_shadow.Render(shadow_offset + element_offset_in_texture);
			}

			if (blur)
			{
				FilterHandleList filters;
				blur.AddHandleTo(filters);
				render_manager.CompositeLayers(render_manager.GetTopLayer(), render_manager.GetNextLayer(), BlendMode::Blend, filters);
				render_manager.PopLayer();
				blur.Release();
			}
		}

		texture_interface.SaveLayerAsTexture();

		render_manager.PopLayer();
		render_manager.SetState(initial_render_state);

		return true;
	};

	Mesh mesh = out_shadow_geometry.Release(Geometry::ReleaseMode::ClearMesh);
	const byte alpha = byte(opacity * 255.f);
	MeshUtilities::GenerateQuad(mesh, -element_offset_in_texture, Vector2f(texture_dimensions), ColourbPremultiplied(alpha, alpha));

	out_shadow_texture = render_manager.MakeCallbackTexture(std::move(texture_callback));
	out_shadow_geometry = render_manager.MakeGeometry(std::move(mesh));
}